

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_float,_float,_float,_float>_>
::doEvaluate(IVal *__return_storage_ptr__,
            Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_float,_float,_float,_float>_>
            *this,EvalContext *ctx)

{
  Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_float,_float,_float,_float>_>
  *this_00;
  Expr<float> *pEVar1;
  IVal local_80;
  IVal local_68;
  IVal local_50;
  IVal local_38;
  EvalContext *local_20;
  EvalContext *ctx_local;
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_float,_float,_float,_float>_>
  *this_local;
  
  this_00 = this->m_func;
  local_20 = ctx;
  ctx_local = (EvalContext *)this;
  this_local = (Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_float,_float,_float,_float>_>
                *)__return_storage_ptr__;
  pEVar1 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::operator->
                     ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)
                      &this->m_args);
  Expr<float>::evaluate(&local_38,pEVar1,local_20);
  pEVar1 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::operator->
                     ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)
                      &(this->m_args).b);
  Expr<float>::evaluate(&local_50,pEVar1,local_20);
  pEVar1 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::operator->
                     ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)
                      &(this->m_args).c);
  Expr<float>::evaluate(&local_68,pEVar1,local_20);
  pEVar1 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::operator->
                     ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)
                      &(this->m_args).d);
  Expr<float>::evaluate(&local_80,pEVar1,local_20);
  Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_float,_float,_float,_float>_>
  ::apply(__return_storage_ptr__,this_00,ctx,&local_38,&local_50,&local_68,&local_80);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		return m_func.apply(ctx,
							m_args.a->evaluate(ctx), m_args.b->evaluate(ctx),
							m_args.c->evaluate(ctx), m_args.d->evaluate(ctx));
	}